

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationiterator.cpp
# Opt level: O1

int64_t __thiscall
icu_63::CollationIterator::previousCE
          (CollationIterator *this,UVector32 *offsets,UErrorCode *errorCode)

{
  UBool UVar1;
  int iVar2;
  int iVar3;
  uint ce32;
  long lVar4;
  int64_t iVar5;
  int c;
  CollationData *this_00;
  
  lVar4 = (long)(this->ceBuffer).length;
  if (lVar4 < 1) {
    UVector32::removeAllElements(offsets);
    iVar2 = (*(this->super_UObject)._vptr_UObject[5])(this);
    iVar3 = (*(this->super_UObject)._vptr_UObject[7])(this,errorCode);
    if (iVar3 < 0) {
      return 0x101000100;
    }
    c = iVar3;
    UVar1 = CollationData::isUnsafeBackward(this->data,iVar3,this->isNumeric);
    if (UVar1 != '\0') {
      iVar5 = previousCEUnsafe(this,c,offsets,errorCode);
      return iVar5;
    }
    ce32 = CollationData::getCE32(this->data,iVar3);
    this_00 = this->data;
    if (ce32 == 0xc0) {
      this_00 = this_00->base;
      ce32 = CollationData::getCE32(this_00,iVar3);
    }
    if (((~ce32 & 0xc0) != 0) || (0xfffffffd < (ce32 & 0xf) - 3)) {
      if ((ce32 & 0xff) < 0xc0) {
        return (ulong)((ce32 & 0xff) << 8) | CONCAT44(ce32,ce32 << 0x10) & 0xffff0000ff000000;
      }
      if ((ce32 & 0xf) != 1) {
        return (ulong)(ce32 & 0xffffff00);
      }
      return (ulong)(ce32 & 0xffffff00) << 0x20 | 0x5000500;
    }
    appendCEsFromCE32(this,this_00,iVar3,ce32,'\0',errorCode);
    if (U_ZERO_ERROR < *errorCode) {
      return 1;
    }
    if (1 < (this->ceBuffer).length) {
      iVar3 = (*(this->super_UObject)._vptr_UObject[5])(this);
      UVector32::addElement(offsets,iVar3,errorCode);
      while (iVar3 = offsets->count, iVar3 <= (this->ceBuffer).length) {
        if (((-2 < iVar3) && (iVar3 < offsets->capacity)) ||
           (UVar1 = UVector32::expandCapacity(offsets,iVar3 + 1,errorCode), UVar1 != '\0')) {
          offsets->elements[offsets->count] = iVar2;
          offsets->count = offsets->count + 1;
        }
      }
    }
    lVar4 = (long)(this->ceBuffer).length;
  }
  (this->ceBuffer).length = (int)lVar4 + -1;
  return (this->ceBuffer).buffer.ptr[lVar4 + -1];
}

Assistant:

int64_t
CollationIterator::previousCE(UVector32 &offsets, UErrorCode &errorCode) {
    if(ceBuffer.length > 0) {
        // Return the previous buffered CE.
        return ceBuffer.get(--ceBuffer.length);
    }
    offsets.removeAllElements();
    int32_t limitOffset = getOffset();
    UChar32 c = previousCodePoint(errorCode);
    if(c < 0) { return Collation::NO_CE; }
    if(data->isUnsafeBackward(c, isNumeric)) {
        return previousCEUnsafe(c, offsets, errorCode);
    }
    // Simple, safe-backwards iteration:
    // Get a CE going backwards, handle prefixes but no contractions.
    uint32_t ce32 = data->getCE32(c);
    const CollationData *d;
    if(ce32 == Collation::FALLBACK_CE32) {
        d = data->base;
        ce32 = d->getCE32(c);
    } else {
        d = data;
    }
    if(Collation::isSimpleOrLongCE32(ce32)) {
        return Collation::ceFromCE32(ce32);
    }
    appendCEsFromCE32(d, c, ce32, FALSE, errorCode);
    if(U_SUCCESS(errorCode)) {
        if(ceBuffer.length > 1) {
            offsets.addElement(getOffset(), errorCode);
            // For an expansion, the offset of each non-initial CE is the limit offset,
            // consistent with forward iteration.
            while(offsets.size() <= ceBuffer.length) {
                offsets.addElement(limitOffset, errorCode);
            };
        }
        return ceBuffer.get(--ceBuffer.length);
    } else {
        return Collation::NO_CE_PRIMARY;
    }
}